

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_attach.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalAttach::GetData
          (PhysicalAttach *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  ClientContext *pCVar1;
  StorageOptions options_00;
  bool bVar2;
  __type _Var3;
  DBConfig *config;
  pointer pAVar4;
  pointer pAVar5;
  FileSystem *fs;
  DatabaseManager *this_00;
  AttachedDatabase *pAVar6;
  Catalog *pCVar7;
  type pAVar8;
  BinderException *this_01;
  MissingExtensionException *this_02;
  string *name;
  string *path;
  unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true> *info;
  allocator local_201;
  optional_ptr<duckdb::AttachedDatabase,_true> existing_db;
  StorageOptions storage_options;
  string extension;
  optional_ptr<duckdb::AttachedDatabase,_true> attached_db;
  AttachOptions options;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  config = DBConfig::GetConfig(context->client);
  info = &this->info;
  AttachOptions::AttachOptions(&options,info,(config->options).access_mode);
  pAVar4 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     (info);
  pAVar5 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     (info);
  path = &pAVar5->path;
  if (options.db_type._M_string_length == 0) {
    DBPathAndType::ExtractExtensionPrefix(path,&options.db_type);
  }
  name = &pAVar4->name;
  if ((pAVar4->name)._M_string_length == 0) {
    fs = FileSystem::GetFileSystem(context->client);
    AttachedDatabase::ExtractDatabaseName((string *)&storage_options,path,fs);
    ::std::__cxx11::string::operator=((string *)name,(string *)&storage_options);
    ::std::__cxx11::string::~string((string *)&storage_options);
  }
  this_00 = DatabaseManager::Get(context->client);
  pAVar4 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     (info);
  if (((pAVar4->on_conflict == IGNORE_ON_CONFLICT) ||
      (pAVar4 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::
                operator->(info), pAVar4->on_conflict == REPLACE_ON_CONFLICT)) &&
     (existing_db = DatabaseManager::GetDatabase(this_00,context->client,name),
     existing_db.ptr != (AttachedDatabase *)0x0)) {
    pAVar6 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&existing_db);
    bVar2 = AttachedDatabase::IsReadOnly(pAVar6);
    if (bVar2 && options.access_mode == READ_WRITE) {
LAB_0191b8ea:
      pAVar6 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&existing_db);
      bVar2 = AttachedDatabase::IsReadOnly(pAVar6);
      EnumUtil::ToString<duckdb::AccessMode>((string *)&storage_options,bVar2 ^ READ_WRITE);
      EnumUtil::ToString<duckdb::AccessMode>(&extension,options.access_mode);
      this_01 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&attached_db,
                 "Database \"%s\" is already attached in %s mode, cannot re-attach in %s mode",
                 &local_201);
      ::std::__cxx11::string::string((string *)&local_50,(string *)name);
      ::std::__cxx11::string::string((string *)&local_70,(string *)&storage_options);
      ::std::__cxx11::string::string((string *)&local_90,(string *)&extension);
      BinderException::
      BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (this_01,(string *)&attached_db,&local_50,&local_70,&local_90);
      __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pAVar6 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&existing_db);
    bVar2 = AttachedDatabase::IsReadOnly(pAVar6);
    if (!bVar2 && options.access_mode == READ_ONLY) goto LAB_0191b8ea;
    if (options.default_table.name._M_string_length != 0) {
      pAVar6 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&existing_db);
      pCVar7 = AttachedDatabase::GetCatalog(pAVar6);
      Catalog::SetDefaultTable(pCVar7,&options.default_table.schema,&options.default_table.name);
    }
    pAVar4 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::
             operator->(info);
    if (pAVar4->on_conflict != REPLACE_ON_CONFLICT) goto LAB_0191b8c9;
    if (options.db_type._M_string_length == 0) {
      ::std::__cxx11::string::string((string *)&storage_options,"duckdb",(allocator *)&extension);
    }
    else {
      ::std::__cxx11::string::string((string *)&storage_options,(string *)&options.db_type);
    }
    pAVar6 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&existing_db);
    pCVar7 = AttachedDatabase::GetCatalog(pAVar6);
    (*pCVar7->_vptr_Catalog[0x16])(&extension,pCVar7);
    _Var3 = ::std::operator==(&extension,path);
    if (_Var3) {
      pAVar6 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&existing_db);
      pCVar7 = AttachedDatabase::GetCatalog(pAVar6);
      (*pCVar7->_vptr_Catalog[6])(&attached_db,pCVar7);
      _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&attached_db,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&storage_options);
      ::std::__cxx11::string::~string((string *)&attached_db);
      ::std::__cxx11::string::~string((string *)&extension);
      ::std::__cxx11::string::~string((string *)&storage_options);
      if (_Var3) goto LAB_0191b8c9;
    }
    else {
      ::std::__cxx11::string::~string((string *)&extension);
      ::std::__cxx11::string::~string((string *)&storage_options);
    }
  }
  ::std::__cxx11::string::string
            ((string *)&extension,anon_var_dwarf_3b2a81b + 9,(allocator *)&storage_options);
  bVar2 = FileSystem::IsRemoteFile((string *)path,(string *)&extension);
  if (bVar2) {
    bVar2 = ExtensionHelper::TryAutoLoadExtension(context->client,&extension);
    if (!bVar2) {
      this_02 = (MissingExtensionException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&storage_options,
                 "Attaching path \'%s\' requires extension \'%s\' to be loaded",
                 (allocator *)&attached_db);
      ::std::__cxx11::string::string((string *)&local_b0,(string *)path);
      ::std::__cxx11::string::string((string *)&local_d0,(string *)&extension);
      MissingExtensionException::
      MissingExtensionException<std::__cxx11::string,std::__cxx11::string>
                (this_02,(string *)&storage_options,&local_b0,&local_d0);
      __cxa_throw(this_02,&MissingExtensionException::typeinfo,::std::runtime_error::~runtime_error)
      ;
    }
    if (options.access_mode == AUTOMATIC) {
      options.access_mode = READ_ONLY;
    }
  }
  pCVar1 = context->client;
  pAVar8 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator*
                     (info);
  DatabaseManager::GetDatabaseType(this_00,pCVar1,pAVar8,config,&options);
  pCVar1 = context->client;
  pAVar8 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator*
                     (info);
  attached_db = DatabaseManager::AttachDatabase(this_00,pCVar1,pAVar8,&options);
  pAVar4 = unique_ptr<duckdb::AttachInfo,_std::default_delete<duckdb::AttachInfo>,_true>::operator->
                     (info);
  AttachInfo::GetStorageOptions(&storage_options,pAVar4);
  pAVar6 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&attached_db);
  options_00.row_group_size.index = storage_options.row_group_size.index;
  options_00.block_alloc_size.index = storage_options.block_alloc_size.index;
  options_00.storage_version.index = storage_options.storage_version.index;
  options_00.block_header_size.index = storage_options.block_header_size.index;
  options_00.encryption = storage_options.encryption;
  options_00._33_7_ = storage_options._33_7_;
  AttachedDatabase::Initialize(pAVar6,context->client,options_00);
  if (options.default_table.name._M_string_length != 0) {
    pAVar6 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&attached_db);
    pCVar7 = AttachedDatabase::GetCatalog(pAVar6);
    Catalog::SetDefaultTable(pCVar7,&options.default_table.schema,&options.default_table.name);
  }
  ::std::__cxx11::string::~string((string *)&extension);
LAB_0191b8c9:
  AttachOptions::~AttachOptions(&options);
  return FINISHED;
}

Assistant:

SourceResultType PhysicalAttach::GetData(ExecutionContext &context, DataChunk &chunk,
                                         OperatorSourceInput &input) const {
	// parse the options
	auto &config = DBConfig::GetConfig(context.client);
	AttachOptions options(info, config.options.access_mode);

	// get the name and path of the database
	auto &name = info->name;
	auto &path = info->path;
	if (options.db_type.empty()) {
		DBPathAndType::ExtractExtensionPrefix(path, options.db_type);
	}
	if (name.empty()) {
		auto &fs = FileSystem::GetFileSystem(context.client);
		name = AttachedDatabase::ExtractDatabaseName(path, fs);
	}

	// check ATTACH IF NOT EXISTS
	auto &db_manager = DatabaseManager::Get(context.client);
	if (info->on_conflict == OnCreateConflict::IGNORE_ON_CONFLICT ||
	    info->on_conflict == OnCreateConflict::REPLACE_ON_CONFLICT) {
		// constant-time lookup in the catalog for the db name
		auto existing_db = db_manager.GetDatabase(context.client, name);
		if (existing_db) {
			if ((existing_db->IsReadOnly() && options.access_mode == AccessMode::READ_WRITE) ||
			    (!existing_db->IsReadOnly() && options.access_mode == AccessMode::READ_ONLY)) {

				auto existing_mode = existing_db->IsReadOnly() ? AccessMode::READ_ONLY : AccessMode::READ_WRITE;
				auto existing_mode_str = EnumUtil::ToString(existing_mode);
				auto attached_mode = EnumUtil::ToString(options.access_mode);
				throw BinderException("Database \"%s\" is already attached in %s mode, cannot re-attach in %s mode",
				                      name, existing_mode_str, attached_mode);
			}
			if (!options.default_table.name.empty()) {
				existing_db->GetCatalog().SetDefaultTable(options.default_table.schema, options.default_table.name);
			}
			if (info->on_conflict == OnCreateConflict::REPLACE_ON_CONFLICT) {
				// same path, name and type, DB does not need replacing
				auto const db_type = options.db_type.empty() ? "duckdb" : options.db_type;
				if (existing_db->GetCatalog().GetDBPath() == path &&
				    existing_db->GetCatalog().GetCatalogType() == db_type) {
					return SourceResultType::FINISHED;
				}
			} else {
				return SourceResultType::FINISHED;
			}
		}
	}

	string extension = "";
	if (FileSystem::IsRemoteFile(path, extension)) {
		if (!ExtensionHelper::TryAutoLoadExtension(context.client, extension)) {
			throw MissingExtensionException("Attaching path '%s' requires extension '%s' to be loaded", path,
			                                extension);
		}
		if (options.access_mode == AccessMode::AUTOMATIC) {
			// Attaching of remote files gets bumped to READ_ONLY
			// This is due to the fact that on most (all?) remote files writes to DB are not available
			// and having this raised later is not super helpful
			options.access_mode = AccessMode::READ_ONLY;
		}
	}

	// Get the database type and attach the database.
	db_manager.GetDatabaseType(context.client, *info, config, options);
	auto attached_db = db_manager.AttachDatabase(context.client, *info, options);

	//! Initialize the database.
	const auto storage_options = info->GetStorageOptions();
	attached_db->Initialize(context.client, storage_options);
	if (!options.default_table.name.empty()) {
		attached_db->GetCatalog().SetDefaultTable(options.default_table.schema, options.default_table.name);
	}
	return SourceResultType::FINISHED;
}